

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O3

float Am_Slow_In_Slow_Out_proc(Am_Object *interp,Am_Time *t)

{
  Am_Value *pAVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Am_Time local_28;
  Am_Object local_20;
  float local_14;
  
  Am_Object::Am_Object(&local_20,interp);
  Am_Time::Am_Time(&local_28,t);
  fVar2 = Am_Linear_Timing_proc(&local_20,&local_28);
  Am_Time::~Am_Time(&local_28);
  Am_Object::~Am_Object(&local_20);
  pAVar1 = Am_Object::Get(interp,0x105,0);
  fVar3 = Am_Value::operator_cast_to_float(pAVar1);
  pAVar1 = Am_Object::Get(interp,0x106,0);
  local_14 = Am_Value::operator_cast_to_float(pAVar1);
  fVar2 = atanf((fVar3 + local_14) * fVar2 - fVar3);
  fVar4 = atanf(fVar3);
  fVar3 = atanf(fVar3);
  fVar5 = atanf(local_14);
  return (fVar4 + fVar2) / (fVar5 + fVar3);
}

Assistant:

Am_Define_Method(Am_Timing_Function, float, Am_Slow_In_Slow_Out,
                 (Am_Object interp, Am_Time t))
{
  float fraction = Am_Linear_Timing_proc(interp, t);

  float D_0 = interp.Get(Am_SHARPNESS_1);
  float D_1 = interp.Get(Am_SHARPNESS_2);

  float tau = (float)((atan((D_0 + D_1) * fraction - D_0) + atan(D_0)) /
                      (atan(D_0) + atan(D_1)));

  return tau;
}